

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhi.cpp
# Opt level: O2

FrameOpResult __thiscall QRhi::endOffscreenFrame(QRhi *this,EndFrameFlags flags)

{
  byte bVar1;
  FrameOpResult FVar2;
  QRhiImplementation *pQVar3;
  long in_FS_OFFSET;
  char local_48 [24];
  char *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = this->d;
  bVar1 = pQVar3->inFrame;
  if ((bool)bVar1 == false) {
    local_48[0] = '\x02';
    local_48[1] = '\0';
    local_48[2] = '\0';
    local_48[3] = '\0';
    local_48[0x14] = '\0';
    local_48[0x15] = '\0';
    local_48[0x16] = '\0';
    local_48[0x17] = '\0';
    local_48[4] = '\0';
    local_48[5] = '\0';
    local_48[6] = '\0';
    local_48[7] = '\0';
    local_48[8] = '\0';
    local_48[9] = '\0';
    local_48[10] = '\0';
    local_48[0xb] = '\0';
    local_48[0xc] = '\0';
    local_48[0xd] = '\0';
    local_48[0xe] = '\0';
    local_48[0xf] = '\0';
    local_48[0x10] = '\0';
    local_48[0x11] = '\0';
    local_48[0x12] = '\0';
    local_48[0x13] = '\0';
    local_30 = "default";
    QMessageLogger::warning
              (local_48,"Attempted to call endOffscreenFrame() without an active frame; ignored");
    pQVar3 = this->d;
    bVar1 = pQVar3->inFrame;
  }
  FVar2 = FrameOpSuccess;
  if ((bVar1 & 1) != 0) {
    FVar2 = (*pQVar3->_vptr_QRhiImplementation[0x12])
                      (pQVar3,flags.super_QFlagsStorageHelper<QRhi::EndFrameFlag,_4>.
                              super_QFlagsStorage<QRhi::EndFrameFlag>.i);
    pQVar3 = this->d;
  }
  pQVar3->inFrame = false;
  qDeleteAll<QSet<QRhiResource*>>(&pQVar3->pendingDeleteResources);
  QHash<QRhiResource_*,_QHashDummyValue>::clear(&(this->d->pendingDeleteResources).q_hash);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return FVar2;
  }
  __stack_chk_fail();
}

Assistant:

QRhi::FrameOpResult QRhi::endOffscreenFrame(EndFrameFlags flags)
{
    if (!d->inFrame)
        qWarning("Attempted to call endOffscreenFrame() without an active frame; ignored");

    QRhi::FrameOpResult r = d->inFrame ? d->endOffscreenFrame(flags) : FrameOpSuccess;
    d->inFrame = false;
    qDeleteAll(d->pendingDeleteResources);
    d->pendingDeleteResources.clear();

    return r;
}